

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKeySequenceRevealerFilter.cpp
# Opt level: O1

bool __thiscall
QKeySequenceRevealerFilter::eventFilter
          (QKeySequenceRevealerFilter *this,QObject *object,QEvent *event)

{
  QKeySequence *pQVar1;
  char cVar2;
  byte bVar3;
  undefined1 uVar4;
  QWidget *pQVar5;
  long lVar6;
  longlong __tmp;
  QHelpEvent *he;
  bool bVar7;
  QKeySequence shortcut;
  optional<std::pair<QWidget_*,_QKeySequence>_> ws;
  QArrayDataPointer<char16_t> local_160;
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  char16_t *pcStack_138;
  qsizetype local_130;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  bool local_118;
  undefined1 local_108 [16];
  long local_f8;
  QKeySequence local_f0 [8];
  QKeySequence local_e8 [8];
  QKeySequence local_e0 [8];
  QWidget *local_d8;
  QArrayDataPointer<char16_t> local_d0;
  char local_b8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  if ((*(ushort *)(event + 8) & 0xfffe) != 0x6e) goto LAB_00187127;
  local_118 = false;
  pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
  if (pQVar5 == (QWidget *)0x0) {
LAB_00186cbb:
    pcStack_138 = (char16_t *)((ulong)pcStack_138 & 0xffffffffffffff00);
  }
  else {
    QAbstractButton::shortcut();
    cVar2 = QKeySequence::isEmpty();
    if (cVar2 == '\0') {
      pQVar1 = (QKeySequence *)(local_108 + 8);
      local_108._0_8_ = pQVar5;
      QKeySequence::QKeySequence(pQVar1,(QKeySequence *)&local_160);
      local_148 = (undefined1  [8])local_108._0_8_;
      QKeySequence::QKeySequence((QKeySequence *)local_140,pQVar1);
      pcStack_138 = (char16_t *)CONCAT71(pcStack_138._1_7_,1);
      QKeySequence::~QKeySequence(pQVar1);
      QKeySequence::~QKeySequence((QKeySequence *)&local_160);
    }
    else {
      QKeySequence::~QKeySequence((QKeySequence *)&local_160);
      lVar6 = QToolButton::defaultAction();
      if (lVar6 == 0) {
        bVar3 = 0;
      }
      else {
        QAction::shortcut();
        bVar3 = QKeySequence::isEmpty();
        bVar3 = bVar3 ^ 1;
        QKeySequence::~QKeySequence(local_e8);
      }
      if (bVar3 == 0) {
        lVar6 = QToolButton::menu();
        if (lVar6 == 0) {
          bVar3 = 0;
        }
        else {
          QMenu::menuAction();
          QAction::shortcut();
          bVar3 = QKeySequence::isEmpty();
          bVar3 = bVar3 ^ 1;
          QKeySequence::~QKeySequence(local_f0);
        }
        if (bVar3 == 0) goto LAB_00186cbb;
        QMenu::menuAction();
        QAction::shortcut();
        local_108._0_8_ = pQVar5;
        QKeySequence::QKeySequence((QKeySequence *)(local_108 + 8),(QKeySequence *)&local_160);
        local_148 = (undefined1  [8])local_108._0_8_;
        QKeySequence::QKeySequence((QKeySequence *)local_140,(QKeySequence *)(local_108 + 8));
      }
      else {
        QAction::shortcut();
        local_108._0_8_ = pQVar5;
        QKeySequence::QKeySequence((QKeySequence *)(local_108 + 8),(QKeySequence *)&local_160);
        local_148 = (undefined1  [8])local_108._0_8_;
        QKeySequence::QKeySequence((QKeySequence *)local_140,(QKeySequence *)(local_108 + 8));
      }
      pcStack_138 = (char16_t *)CONCAT71(pcStack_138._1_7_,1);
      QKeySequence::~QKeySequence((QKeySequence *)(local_108 + 8));
      QKeySequence::~QKeySequence((QKeySequence *)&local_160);
    }
  }
  std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
            ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_128,
             (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_148);
  if (pcStack_138._0_1_ == true) {
    pcStack_138 = (char16_t *)((ulong)pcStack_138 & 0xffffffffffffff00);
    QKeySequence::~QKeySequence((QKeySequence *)local_140);
  }
  if (local_118 == false) {
    pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
    if (pQVar5 == (QWidget *)0x0) {
LAB_00186e32:
      pcStack_138 = (char16_t *)((ulong)pcStack_138 & 0xffffffffffffff00);
    }
    else {
      QAbstractButton::shortcut();
      cVar2 = QKeySequence::isEmpty();
      if (cVar2 != '\0') {
        QKeySequence::~QKeySequence((QKeySequence *)&local_160);
        lVar6 = QPushButton::menu();
        if (lVar6 == 0) {
          bVar3 = 0;
        }
        else {
          QMenu::menuAction();
          QAction::shortcut();
          bVar3 = QKeySequence::isEmpty();
          bVar3 = bVar3 ^ 1;
          QKeySequence::~QKeySequence(local_e0);
        }
        if (bVar3 != 0) {
          QMenu::menuAction();
          QAction::shortcut();
          pQVar1 = (QKeySequence *)(local_108 + 8);
          local_108._0_8_ = pQVar5;
          QKeySequence::QKeySequence(pQVar1,(QKeySequence *)&local_160);
          local_148 = (undefined1  [8])local_108._0_8_;
          QKeySequence::QKeySequence((QKeySequence *)local_140,pQVar1);
          pcStack_138 = (char16_t *)CONCAT71(pcStack_138._1_7_,1);
          QKeySequence::~QKeySequence(pQVar1);
          QKeySequence::~QKeySequence((QKeySequence *)&local_160);
          if (bVar3 != 0) goto LAB_00186e37;
        }
        goto LAB_00186e32;
      }
      pQVar1 = (QKeySequence *)(local_108 + 8);
      local_108._0_8_ = pQVar5;
      QKeySequence::QKeySequence(pQVar1,(QKeySequence *)&local_160);
      local_148 = (undefined1  [8])local_108._0_8_;
      QKeySequence::QKeySequence((QKeySequence *)local_140,pQVar1);
      pcStack_138 = (char16_t *)CONCAT71(pcStack_138._1_7_,1);
      QKeySequence::~QKeySequence(pQVar1);
      QKeySequence::~QKeySequence((QKeySequence *)&local_160);
    }
LAB_00186e37:
    std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
              ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_128,
               (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_148);
    if (pcStack_138._0_1_ == true) {
      pcStack_138 = (char16_t *)((ulong)pcStack_138 & 0xffffffffffffff00);
      QKeySequence::~QKeySequence((QKeySequence *)local_140);
    }
  }
  if (local_118 == false) {
    pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
    if (pQVar5 == (QWidget *)0x0) {
      bVar7 = false;
    }
    else {
      QLabel::text();
      bVar7 = local_f8 != 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
    }
    if (bVar7) {
      QLabel::text();
      QKeySequence::mnemonic((QString *)&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
      cVar2 = QKeySequence::isEmpty();
      if (cVar2 == '\0') {
        local_148 = (undefined1  [8])pQVar5;
        QKeySequence::QKeySequence((QKeySequence *)local_140,(QKeySequence *)&local_160);
        std::optional<std::pair<QWidget*,QKeySequence>>::operator=
                  ((optional<std::pair<QWidget*,QKeySequence>> *)local_128,
                   (pair<QWidget_*,_QKeySequence> *)local_148);
        QKeySequence::~QKeySequence((QKeySequence *)local_140);
      }
      QKeySequence::~QKeySequence((QKeySequence *)&local_160);
    }
  }
  if (local_118 == true) {
    local_b0.d = (Data *)0x0;
    local_b0.ptr = L"%1 (%2)";
    local_b0.size = 7;
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    QWidget::toolTip();
    QKeySequence::toString(&local_78,&uStack_120,1);
    QString::arg<QString,QString>
              ((type *)&local_48,(QString *)&local_b0,(QString *)&local_60,(QString *)&local_78);
    QString::trimmed_helper((QString *)&local_160);
    local_d0.size = local_160.size;
    local_d0.ptr = local_160.ptr;
    local_d0.d = local_160.d;
    local_148 = local_128;
    local_160.d = (Data *)0x0;
    local_160.ptr = (char16_t *)0x0;
    local_160.size = 0;
    local_d8 = (QWidget *)local_128;
    local_140 = (undefined1  [8])0x0;
    pcStack_138 = (char16_t *)0x0;
    local_130 = 0;
    local_b8 = '\x01';
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  else {
    local_b8 = '\0';
  }
  if (local_118 == true) {
    local_118 = false;
    QKeySequence::~QKeySequence((QKeySequence *)&uStack_120);
  }
  cVar2 = local_b8;
  if (local_b8 == '\x01') {
    if (*(short *)(event + 8) == 0x6f) {
      QWhatsThis::showText((QPoint *)(event + 0x18),(QString *)&local_d0,local_d8);
    }
    else if (*(short *)(event + 8) == 0x6e) {
      local_128 = (undefined1  [8])0x0;
      uStack_120 = 0xffffffffffffffff;
      QToolTip::showText((QPoint *)(event + 0x18),(QString *)&local_d0,local_d8,(QRect *)local_128,
                         -1);
    }
  }
  if (local_b8 == '\x01') {
    local_b8 = '\0';
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  }
  if (cVar2 != '\0') {
    return true;
  }
LAB_00187127:
  uVar4 = QObject::eventFilter(&this->super_QObject,(QEvent *)object);
  return (bool)uVar4;
}

Assistant:

bool QKeySequenceRevealerFilter::eventFilter(QObject *object, QEvent *event) {
    switch (event->type()) {
    case QEvent::ToolTip:
    case QEvent::WhatsThis: {
        const auto widgetToolTip = [&]() -> std::optional<WidgetToolTip> {
            std::optional<WidgetSequence> ws;

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QToolButton *>(object));
            }

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QPushButton *>(object));
            }

            if (!ws) {
                if (auto label = qobject_cast<QLabel *>(object); label && !label->text().isEmpty()) {
                    const auto sequence = QKeySequence::mnemonic(label->text());

                    if (!sequence.isEmpty()) {
                        ws = {label, sequence};
                    }
                }
            }

            return ws
                ? WidgetToolTip {ws->first, QSL("%1 (%2)").arg(ws->first->toolTip(), ws->second.toString()).trimmed()}
                : std::optional<WidgetToolTip> {};
        }();

        if (widgetToolTip) {
            if (event->type() == QEvent::ToolTip) {
                const auto he = static_cast<QHelpEvent *>(event);
                QToolTip::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            } else if (event->type() == QEvent::WhatsThis) {
                const auto he = static_cast<QHelpEvent *>(event);
                QWhatsThis::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            }

            return true;
        }

        break;
    }
    default:
        break;
    }

    return QObject::eventFilter(object, event);
}